

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_ratelimit(Curl_easy *data,curltime now)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [12];
  timediff_t tVar6;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  Curl_easy *data_local;
  curltime now_local;
  
  auVar5 = now._0_12_;
  if (((data->set).max_recv_speed != 0) &&
     (uVar1 = (data->progress).dl.limit.start.tv_sec,
     uVar2 = (data->progress).dl.limit.start.tv_usec, older.tv_usec = uVar2, older.tv_sec = uVar1,
     newer._12_4_ = 0, newer.tv_sec = auVar5._0_8_, newer.tv_usec = auVar5._8_4_, older._12_4_ = 0,
     tVar6 = Curl_timediff(newer,older), 2999 < tVar6)) {
    (data->progress).dl.limit.start.tv_sec = now.tv_sec;
    *(ulong *)&(data->progress).dl.limit.start.tv_usec =
         CONCAT44(now_local.tv_sec._4_4_,now.tv_usec);
    (data->progress).dl.limit.start_size = (data->progress).dl.cur_size;
  }
  if (((data->set).max_send_speed != 0) &&
     (uVar3 = (data->progress).ul.limit.start.tv_sec,
     uVar4 = (data->progress).ul.limit.start.tv_usec, older_00.tv_usec = uVar4,
     older_00.tv_sec = uVar3, newer_00._12_4_ = 0, newer_00.tv_sec = auVar5._0_8_,
     newer_00.tv_usec = auVar5._8_4_, older_00._12_4_ = 0, tVar6 = Curl_timediff(newer_00,older_00),
     2999 < tVar6)) {
    (data->progress).ul.limit.start.tv_sec = now.tv_sec;
    *(ulong *)&(data->progress).ul.limit.start.tv_usec =
         CONCAT44(now_local.tv_sec._4_4_,now.tv_usec);
    (data->progress).ul.limit.start_size = (data->progress).ul.cur_size;
  }
  return;
}

Assistant:

void Curl_ratelimit(struct Curl_easy *data, struct curltime now)
{
  /* do not set a new stamp unless the time since last update is long enough */
  if(data->set.max_recv_speed) {
    if(Curl_timediff(now, data->progress.dl.limit.start) >=
       MIN_RATE_LIMIT_PERIOD) {
      data->progress.dl.limit.start = now;
      data->progress.dl.limit.start_size = data->progress.dl.cur_size;
    }
  }
  if(data->set.max_send_speed) {
    if(Curl_timediff(now, data->progress.ul.limit.start) >=
       MIN_RATE_LIMIT_PERIOD) {
      data->progress.ul.limit.start = now;
      data->progress.ul.limit.start_size = data->progress.ul.cur_size;
    }
  }
}